

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_type_createAnonymousClass
          (sysbvm_context_t *context,sysbvm_tuple_t supertype,sysbvm_tuple_t metaclass)

{
  sysbvm_object_tuple_t *psVar1;
  uint64_t value;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  
  if ((metaclass & 0xf) == 0 && metaclass != 0) {
    uVar3 = *(ulong *)(metaclass + 0x58);
    if (uVar3 == 0 || (uVar3 & 0xf) != 0) {
      uVar3 = (long)uVar3 >> 4;
    }
    else {
      uVar3 = *(ulong *)(uVar3 + 0x10);
    }
  }
  else {
    uVar3 = 0;
  }
  if (uVar3 < 0x1d) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/type.c:82: assertion failure: classSlotCount >= SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_class_t)"
              );
  }
  psVar1 = sysbvm_context_allocatePointerTuple(context,metaclass,uVar3);
  psVar1[2].header.field_0.typePointer = supertype;
  psVar1[3].field_1.pointers[0] = 0xb;
  psVar1[4].header.field_0.typePointer = 0xb;
  psVar1[4].header.identityHashAndFlags = 0xb;
  psVar1[4].header.objectSize = 0;
  psVar1[4].field_1.pointers[0] = 0x1b;
  if (supertype != 0) {
    if ((supertype & 0xf) == 0) {
      uVar3 = *(ulong *)(supertype + 0x58);
      if (uVar3 == 0 || (uVar3 & 0xf) != 0) {
        value = (long)uVar3 >> 4;
      }
      else {
        value = *(uint64_t *)(uVar3 + 0x10);
      }
    }
    else {
      value = 0;
    }
    if (value + 0x800000000000000 >> 0x3c == 0) {
      sVar2 = value << 4 | 0xb;
    }
    else {
      sVar2 = sysbvm_tuple_uint64_encodeBig(context,value);
    }
    psVar1[3].field_1.pointers[0] = sVar2;
  }
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousClass(sysbvm_context_t *context, sysbvm_tuple_t supertype, sysbvm_tuple_t metaclass)
{
    size_t classSlotCount = sysbvm_type_getTotalSlotCount(metaclass);
    SYSBVM_ASSERT(classSlotCount >= SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_class_t));

    sysbvm_class_t* result = (sysbvm_class_t*)sysbvm_context_allocatePointerTuple(context, metaclass, classSlotCount);
    result->super.supertype = supertype;
    result->super.totalSlotCount = sysbvm_tuple_size_encode(context, 0);
    result->super.instanceSize = sysbvm_tuple_size_encode(context, 0);
    result->super.instanceAlignment = sysbvm_tuple_size_encode(context, 0);
    result->super.flags = sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_CLASS_DEFAULT_FLAGS);
    if(supertype)
        result->super.totalSlotCount = sysbvm_tuple_size_encode(context, sysbvm_type_getTotalSlotCount(supertype));
    return (sysbvm_tuple_t)result;
}